

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar72;
  undefined1 auVar64 [32];
  float fVar66;
  float fVar68;
  float fVar70;
  undefined1 auVar65 [64];
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar76 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float fVar63;
  float fVar67;
  float fVar69;
  float fVar71;
  
  auVar65._4_60_ = in_register_00001204;
  auVar65._0_4_ = scale;
  fVar10 = scale * r_scale0;
  pBVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar8 = pBVar7[itime].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[itime].super_RawBufferView.stride;
  lVar36 = (uVar5 + 1) * sVar9;
  lVar35 = (uVar5 + 2) * sVar9;
  lVar34 = (uVar5 + 3) * sVar9;
  aVar4 = ofs->field_0;
  auVar40 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + uVar5 * sVar9),(undefined1  [16])aVar4);
  auVar41 = vshufps_avx(auVar65._0_16_,auVar65._0_16_,0);
  fVar62 = auVar41._0_4_;
  auVar37._0_4_ = fVar62 * auVar40._0_4_;
  fVar66 = auVar41._4_4_;
  auVar37._4_4_ = fVar66 * auVar40._4_4_;
  fVar68 = auVar41._8_4_;
  auVar37._8_4_ = fVar68 * auVar40._8_4_;
  fVar70 = auVar41._12_4_;
  auVar37._12_4_ = fVar70 * auVar40._12_4_;
  auVar40 = vshufps_avx(auVar37,auVar37,0);
  auVar39 = vshufps_avx(auVar37,auVar37,0x55);
  auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
  fVar13 = (space->vx).field_0.m128[0];
  fVar19 = (space->vx).field_0.m128[1];
  fVar20 = (space->vx).field_0.m128[2];
  fVar21 = (space->vx).field_0.m128[3];
  fVar63 = (space->vy).field_0.m128[0];
  fVar67 = (space->vy).field_0.m128[1];
  fVar69 = (space->vy).field_0.m128[2];
  fVar71 = (space->vy).field_0.m128[3];
  fVar73 = 0.0;
  auVar41 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar76 = ZEXT1664(auVar41);
  fVar75 = auVar41._0_4_;
  fVar77 = auVar41._4_4_;
  fVar78 = auVar41._8_4_;
  fVar79 = auVar41._12_4_;
  auVar46._0_4_ = auVar40._0_4_ * fVar13 + fVar63 * auVar39._0_4_ + fVar75 * auVar37._0_4_;
  auVar46._4_4_ = auVar40._4_4_ * fVar19 + fVar67 * auVar39._4_4_ + fVar77 * auVar37._4_4_;
  auVar46._8_4_ = auVar40._8_4_ * fVar20 + fVar69 * auVar39._8_4_ + fVar78 * auVar37._8_4_;
  auVar46._12_4_ = auVar40._12_4_ * fVar21 + fVar71 * auVar39._12_4_ + fVar79 * auVar37._12_4_;
  fVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          maxRadiusScale;
  auVar41 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar36),(undefined1  [16])aVar4);
  auVar50._0_4_ = fVar62 * auVar41._0_4_;
  auVar50._4_4_ = fVar66 * auVar41._4_4_;
  auVar50._8_4_ = fVar68 * auVar41._8_4_;
  auVar50._12_4_ = fVar70 * auVar41._12_4_;
  auVar41 = vshufps_avx(auVar50,auVar50,0);
  auVar40 = vshufps_avx(auVar50,auVar50,0x55);
  auVar39 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar54._0_4_ = auVar41._0_4_ * fVar13 + fVar63 * auVar40._0_4_ + fVar75 * auVar39._0_4_;
  auVar54._4_4_ = auVar41._4_4_ * fVar19 + fVar67 * auVar40._4_4_ + fVar77 * auVar39._4_4_;
  auVar54._8_4_ = auVar41._8_4_ * fVar20 + fVar69 * auVar40._8_4_ + fVar78 * auVar39._8_4_;
  auVar54._12_4_ = auVar41._12_4_ * fVar21 + fVar71 * auVar40._12_4_ + fVar79 * auVar39._12_4_;
  fVar11 = fVar10 * fVar3 * *(float *)(pcVar8 + lVar36 + 0xc);
  auVar41 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar35),(undefined1  [16])aVar4);
  auVar56._0_4_ = fVar62 * auVar41._0_4_;
  auVar56._4_4_ = fVar66 * auVar41._4_4_;
  auVar56._8_4_ = fVar68 * auVar41._8_4_;
  auVar56._12_4_ = fVar70 * auVar41._12_4_;
  auVar41 = vshufps_avx(auVar56,auVar56,0);
  auVar40 = vshufps_avx(auVar56,auVar56,0x55);
  auVar39 = vshufps_avx(auVar56,auVar56,0xaa);
  auVar59._0_4_ = auVar41._0_4_ * fVar13 + fVar63 * auVar40._0_4_ + fVar75 * auVar39._0_4_;
  auVar59._4_4_ = auVar41._4_4_ * fVar19 + fVar67 * auVar40._4_4_ + fVar77 * auVar39._4_4_;
  auVar59._8_4_ = auVar41._8_4_ * fVar20 + fVar69 * auVar40._8_4_ + fVar78 * auVar39._8_4_;
  auVar59._12_4_ = auVar41._12_4_ * fVar21 + fVar71 * auVar40._12_4_ + fVar79 * auVar39._12_4_;
  fVar12 = fVar10 * fVar3 * *(float *)(pcVar8 + lVar35 + 0xc);
  auVar41 = vsubps_avx(*(undefined1 (*) [16])(pcVar8 + lVar34),(undefined1  [16])aVar4);
  auVar39._0_4_ = fVar62 * auVar41._0_4_;
  auVar39._4_4_ = fVar66 * auVar41._4_4_;
  auVar39._8_4_ = fVar68 * auVar41._8_4_;
  auVar39._12_4_ = fVar70 * auVar41._12_4_;
  auVar41 = vshufps_avx(auVar39,auVar39,0);
  auVar40 = vshufps_avx(auVar39,auVar39,0x55);
  auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
  fVar63 = fVar63 * auVar40._0_4_;
  fVar67 = fVar67 * auVar40._4_4_;
  fVar69 = fVar69 * auVar40._8_4_;
  fVar71 = fVar71 * auVar40._12_4_;
  auVar65 = ZEXT1664(CONCAT412(fVar71,CONCAT48(fVar69,CONCAT44(fVar67,fVar63))));
  auVar40._0_4_ = auVar41._0_4_ * fVar13 + fVar63 + fVar75 * auVar39._0_4_;
  auVar40._4_4_ = auVar41._4_4_ * fVar19 + fVar67 + fVar77 * auVar39._4_4_;
  auVar40._8_4_ = auVar41._8_4_ * fVar20 + fVar69 + fVar78 * auVar39._8_4_;
  auVar40._12_4_ = auVar41._12_4_ * fVar21 + fVar71 + fVar79 * auVar39._12_4_;
  fVar13 = fVar3 * *(float *)(pcVar8 + lVar34 + 0xc) * fVar10;
  uVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar32 = (ulong)uVar6;
  auVar39 = ZEXT416((uint)(fVar10 * fVar3 * *(float *)(pcVar8 + uVar5 * sVar9 + 0xc)));
  auVar41 = ZEXT416((uint)fVar13);
  if (uVar32 == 4) {
    auVar37 = vshufps_avx(auVar40,auVar40,0);
    auVar50 = vshufps_avx(auVar40,auVar40,0x55);
    auVar56 = vshufps_avx(auVar40,auVar40,0xaa);
    auVar52 = vshufps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13),0);
    auVar42 = vshufps_avx(auVar59,auVar59,0);
    auVar47 = vshufps_avx(auVar59,auVar59,0x55);
    auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
    auVar38 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
    auVar57 = vshufps_avx(auVar54,auVar54,0);
    auVar48 = vshufps_avx(auVar54,auVar54,0x55);
    auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
    auVar16 = vshufps_avx(auVar46,auVar46,0);
    auVar17 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
    auVar18 = vshufps_avx(auVar46,auVar46,0x55);
    auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar51._0_4_ =
         auVar57._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar42._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar37._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar16._0_4_ * (float)bezier_basis0._272_4_;
    auVar51._4_4_ =
         auVar57._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar42._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar37._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar16._4_4_ * (float)bezier_basis0._276_4_;
    auVar51._8_4_ =
         auVar57._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar42._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar37._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar16._8_4_ * (float)bezier_basis0._280_4_;
    auVar51._12_4_ =
         auVar57._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar42._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar37._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar16._12_4_ * (float)bezier_basis0._284_4_;
    auVar57._0_4_ =
         auVar48._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar47._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar50._0_4_ * (float)bezier_basis0._3740_4_ +
         (float)bezier_basis0._272_4_ * auVar18._0_4_;
    auVar57._4_4_ =
         auVar48._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar47._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar50._4_4_ * (float)bezier_basis0._3744_4_ +
         (float)bezier_basis0._276_4_ * auVar18._4_4_;
    auVar57._8_4_ =
         auVar48._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar47._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar50._8_4_ * (float)bezier_basis0._3748_4_ +
         (float)bezier_basis0._280_4_ * auVar18._8_4_;
    auVar57._12_4_ =
         auVar48._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar47._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar50._12_4_ * (float)bezier_basis0._3752_4_ +
         (float)bezier_basis0._284_4_ * auVar18._12_4_;
    auVar47._0_4_ =
         (float)bezier_basis0._272_4_ * auVar46._0_4_ +
         auVar59._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar56._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar54._0_4_ * (float)bezier_basis0._1428_4_;
    auVar47._4_4_ =
         (float)bezier_basis0._276_4_ * auVar46._4_4_ +
         auVar59._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar56._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar54._4_4_ * (float)bezier_basis0._1432_4_;
    auVar47._8_4_ =
         (float)bezier_basis0._280_4_ * auVar46._8_4_ +
         auVar59._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar56._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar54._8_4_ * (float)bezier_basis0._1436_4_;
    auVar47._12_4_ =
         (float)bezier_basis0._284_4_ * auVar46._12_4_ +
         auVar59._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar56._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar54._12_4_ * (float)bezier_basis0._1440_4_;
    auVar42._0_4_ =
         (float)bezier_basis0._272_4_ * auVar39._0_4_ +
         auVar17._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar52._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar38._0_4_ * (float)bezier_basis0._2584_4_;
    auVar42._4_4_ =
         (float)bezier_basis0._276_4_ * auVar39._4_4_ +
         auVar17._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar52._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar38._4_4_ * (float)bezier_basis0._2588_4_;
    auVar42._8_4_ =
         (float)bezier_basis0._280_4_ * auVar39._8_4_ +
         auVar17._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar52._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar38._8_4_ * (float)bezier_basis0._2592_4_;
    auVar42._12_4_ =
         (float)bezier_basis0._284_4_ * auVar39._12_4_ +
         auVar17._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar52._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar38._12_4_ * (float)bezier_basis0._2596_4_;
    auVar50 = vshufps_avx(auVar51,auVar51,0xb1);
    auVar39 = vminps_avx(auVar50,auVar51);
    auVar37 = vshufpd_avx(auVar39,auVar39,1);
    auVar39 = vminps_avx(auVar37,auVar39);
    auVar54 = vshufps_avx(auVar57,auVar57,0xb1);
    auVar37 = vminps_avx(auVar54,auVar57);
    auVar46 = vshufpd_avx(auVar37,auVar37,1);
    auVar37 = vminps_avx(auVar46,auVar37);
    auVar39 = vinsertps_avx(auVar39,auVar37,0x1c);
    auVar56 = vshufps_avx(auVar47,auVar47,0xb1);
    auVar37 = vminps_avx(auVar56,auVar47);
    auVar46 = vshufpd_avx(auVar37,auVar37,1);
    auVar37 = vminps_avx(auVar46,auVar37);
    auVar37 = vinsertps_avx(auVar39,auVar37,0x20);
    auVar39 = vmaxps_avx(auVar50,auVar51);
    auVar46 = vshufpd_avx(auVar39,auVar39,1);
    auVar39 = vmaxps_avx(auVar46,auVar39);
    auVar46 = vmaxps_avx(auVar54,auVar57);
    auVar50 = vshufpd_avx(auVar46,auVar46,1);
    auVar46 = vmaxps_avx(auVar50,auVar46);
    auVar39 = vinsertps_avx(auVar39,auVar46,0x1c);
    auVar46 = vmaxps_avx(auVar56,auVar47);
    auVar50 = vshufpd_avx(auVar46,auVar46,1);
    auVar46 = vmaxps_avx(auVar50,auVar46);
    auVar39 = vinsertps_avx(auVar39,auVar46,0x20);
    auVar52._8_4_ = 0x7fffffff;
    auVar52._0_8_ = 0x7fffffff7fffffff;
    auVar52._12_4_ = 0x7fffffff;
    auVar46 = vandps_avx(auVar42,auVar52);
    auVar50 = vshufps_avx(auVar46,auVar46,0xb1);
    auVar46 = vmaxps_avx(auVar50,auVar46);
    auVar50 = vshufps_avx(auVar46,auVar46,0);
    auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
    auVar46 = vmaxps_avx(auVar46,auVar50);
  }
  else {
    if ((int)uVar6 < 1) {
      auVar81._8_4_ = 0x7f800000;
      auVar81._0_8_ = 0x7f8000007f800000;
      auVar81._12_4_ = 0x7f800000;
      auVar81._16_4_ = 0x7f800000;
      auVar81._20_4_ = 0x7f800000;
      auVar81._24_4_ = 0x7f800000;
      auVar81._28_4_ = 0x7f800000;
      auVar82._8_4_ = 0xff800000;
      auVar82._0_8_ = 0xff800000ff800000;
      auVar82._12_4_ = 0xff800000;
      auVar82._16_4_ = 0xff800000;
      auVar82._20_4_ = 0xff800000;
      auVar82._24_4_ = 0xff800000;
      auVar82._28_4_ = 0xff800000;
      auVar45 = ZEXT832(0);
      auVar58 = auVar81;
      auVar49 = auVar81;
      auVar80 = auVar82;
      auVar55 = auVar82;
    }
    else {
      auVar37 = vpshufd_avx(ZEXT416(uVar6),0);
      auVar50 = vshufps_avx(auVar46,auVar46,0);
      auVar56 = vshufps_avx(auVar46,auVar46,0x55);
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar39 = vshufps_avx(auVar39,auVar39,0);
      auVar52 = vshufps_avx(auVar54,auVar54,0);
      auVar42 = vshufps_avx(auVar54,auVar54,0x55);
      auVar54 = vshufps_avx(auVar54,auVar54,0xaa);
      auVar47 = vshufps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),0);
      auVar38 = vshufps_avx(auVar59,auVar59,0);
      auVar57 = vshufps_avx(auVar59,auVar59,0x55);
      auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
      auVar48 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
      auVar16 = vshufps_avx(auVar40,auVar40,0);
      auVar17 = vshufps_avx(auVar40,auVar40,0x55);
      auVar18 = vshufps_avx(auVar40,auVar40,0xaa);
      auVar51 = vshufps_avx(auVar41,auVar41,0);
      lVar34 = uVar32 * 0x44;
      uVar33 = 0;
      auVar43 = ZEXT864(0) << 0x20;
      auVar55._8_4_ = 0xff800000;
      auVar55._0_8_ = 0xff800000ff800000;
      auVar55._12_4_ = 0xff800000;
      auVar55._16_4_ = 0xff800000;
      auVar55._20_4_ = 0xff800000;
      auVar55._24_4_ = 0xff800000;
      auVar55._28_4_ = 0xff800000;
      auVar49._8_4_ = 0x7f800000;
      auVar49._0_8_ = 0x7f8000007f800000;
      auVar49._12_4_ = 0x7f800000;
      auVar49._16_4_ = 0x7f800000;
      auVar49._20_4_ = 0x7f800000;
      auVar49._24_4_ = 0x7f800000;
      auVar49._28_4_ = 0x7f800000;
      auVar58 = auVar49;
      auVar80 = auVar55;
      auVar81 = auVar49;
      auVar82 = auVar55;
      do {
        auVar15 = vpshufd_avx(ZEXT416((uint)uVar33),0);
        auVar14 = vpor_avx(auVar15,_DAT_01f7fcf0);
        auVar15 = vpor_avx(auVar15,_DAT_01fafea0);
        auVar14 = vpcmpgtd_avx(auVar37,auVar14);
        auVar14 = vpackssdw_avx(auVar14,auVar14);
        auVar15 = vpcmpgtd_avx(auVar37,auVar15);
        auVar14 = vpunpcklwd_avx(auVar14,auVar14);
        auVar53._16_16_ = auVar15;
        auVar53._0_16_ = auVar14;
        pfVar1 = (float *)(lVar34 + 0x21aabec + uVar33 * 4);
        fVar3 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        fVar13 = pfVar1[4];
        fVar19 = pfVar1[5];
        fVar20 = pfVar1[6];
        pfVar2 = (float *)(lVar34 + 0x21ab070 + uVar33 * 4);
        fVar21 = *pfVar2;
        fVar63 = pfVar2[1];
        fVar67 = pfVar2[2];
        fVar69 = pfVar2[3];
        fVar71 = pfVar2[4];
        fVar62 = pfVar2[5];
        fVar66 = pfVar2[6];
        fVar68 = pfVar2[7];
        local_1a8 = auVar16._0_4_;
        fStack_1a4 = auVar16._4_4_;
        fStack_1a0 = auVar16._8_4_;
        fStack_19c = auVar16._12_4_;
        local_1c8 = auVar17._0_4_;
        fStack_1c4 = auVar17._4_4_;
        fStack_1c0 = auVar17._8_4_;
        fStack_1bc = auVar17._12_4_;
        local_1e8 = auVar18._0_4_;
        fStack_1e4 = auVar18._4_4_;
        fStack_1e0 = auVar18._8_4_;
        fStack_1dc = auVar18._12_4_;
        local_128 = auVar38._0_4_;
        fStack_124 = auVar38._4_4_;
        fStack_120 = auVar38._8_4_;
        fStack_11c = auVar38._12_4_;
        local_148 = auVar57._0_4_;
        fStack_144 = auVar57._4_4_;
        fStack_140 = auVar57._8_4_;
        fStack_13c = auVar57._12_4_;
        fVar72 = auVar65._28_4_ + fVar73;
        local_168 = auVar59._0_4_;
        fStack_164 = auVar59._4_4_;
        fStack_160 = auVar59._8_4_;
        fStack_15c = auVar59._12_4_;
        fVar74 = fVar73 + auVar76._28_4_;
        pfVar2 = (float *)(lVar34 + 0x21aa768 + uVar33 * 4);
        fVar70 = *pfVar2;
        fVar75 = pfVar2[1];
        fVar77 = pfVar2[2];
        fVar78 = pfVar2[3];
        fVar79 = pfVar2[4];
        fVar22 = pfVar2[5];
        fVar23 = pfVar2[6];
        fVar24 = pfVar2[7];
        local_208 = auVar51._0_4_;
        fStack_204 = auVar51._4_4_;
        fStack_200 = auVar51._8_4_;
        fStack_1fc = auVar51._12_4_;
        local_188 = auVar48._0_4_;
        fStack_184 = auVar48._4_4_;
        fStack_180 = auVar48._8_4_;
        fStack_17c = auVar48._12_4_;
        local_a8 = auVar52._0_4_;
        fStack_a4 = auVar52._4_4_;
        fStack_a0 = auVar52._8_4_;
        fStack_9c = auVar52._12_4_;
        local_c8 = auVar42._0_4_;
        fStack_c4 = auVar42._4_4_;
        fStack_c0 = auVar42._8_4_;
        fStack_bc = auVar42._12_4_;
        local_e8 = auVar54._0_4_;
        fStack_e4 = auVar54._4_4_;
        fStack_e0 = auVar54._8_4_;
        fStack_dc = auVar54._12_4_;
        pfVar2 = (float *)(bezier_basis0 + uVar33 * 4 + lVar34);
        fVar25 = *pfVar2;
        fVar26 = pfVar2[1];
        fVar27 = pfVar2[2];
        fVar28 = pfVar2[3];
        fVar29 = pfVar2[4];
        fVar30 = pfVar2[5];
        fVar31 = pfVar2[6];
        fVar73 = pfVar2[7];
        local_108 = auVar47._0_4_;
        fStack_104 = auVar47._4_4_;
        fStack_100 = auVar47._8_4_;
        fStack_fc = auVar47._12_4_;
        local_28 = auVar50._0_4_;
        fStack_24 = auVar50._4_4_;
        fStack_20 = auVar50._8_4_;
        fStack_1c = auVar50._12_4_;
        auVar44._0_4_ =
             fVar25 * local_28 + fVar70 * local_a8 + fVar21 * local_1a8 + fVar3 * local_128;
        auVar44._4_4_ =
             fVar26 * fStack_24 + fVar75 * fStack_a4 + fVar63 * fStack_1a4 + fVar10 * fStack_124;
        auVar44._8_4_ =
             fVar27 * fStack_20 + fVar77 * fStack_a0 + fVar67 * fStack_1a0 + fVar11 * fStack_120;
        auVar44._12_4_ =
             fVar28 * fStack_1c + fVar78 * fStack_9c + fVar69 * fStack_19c + fVar12 * fStack_11c;
        auVar44._16_4_ =
             fVar29 * local_28 + fVar79 * local_a8 + fVar71 * local_1a8 + fVar13 * local_128;
        auVar44._20_4_ =
             fVar30 * fStack_24 + fVar22 * fStack_a4 + fVar62 * fStack_1a4 + fVar19 * fStack_124;
        auVar44._24_4_ =
             fVar31 * fStack_20 + fVar23 * fStack_a0 + fVar66 * fStack_1a0 + fVar20 * fStack_120;
        auVar44._28_4_ = fVar24 + fVar68 + auVar65._28_4_ + 0.0;
        local_48 = auVar56._0_4_;
        fStack_44 = auVar56._4_4_;
        fStack_40 = auVar56._8_4_;
        fStack_3c = auVar56._12_4_;
        auVar61._0_4_ =
             fVar25 * local_48 + fVar70 * local_c8 + fVar3 * local_148 + fVar21 * local_1c8;
        auVar61._4_4_ =
             fVar26 * fStack_44 + fVar75 * fStack_c4 + fVar10 * fStack_144 + fVar63 * fStack_1c4;
        auVar61._8_4_ =
             fVar27 * fStack_40 + fVar77 * fStack_c0 + fVar11 * fStack_140 + fVar67 * fStack_1c0;
        auVar61._12_4_ =
             fVar28 * fStack_3c + fVar78 * fStack_bc + fVar12 * fStack_13c + fVar69 * fStack_1bc;
        auVar61._16_4_ =
             fVar29 * local_48 + fVar79 * local_c8 + fVar13 * local_148 + fVar71 * local_1c8;
        auVar61._20_4_ =
             fVar30 * fStack_44 + fVar22 * fStack_c4 + fVar19 * fStack_144 + fVar62 * fStack_1c4;
        auVar61._24_4_ =
             fVar31 * fStack_40 + fVar23 * fStack_c0 + fVar20 * fStack_140 + fVar66 * fStack_1c0;
        auVar61._28_4_ = fVar24 + fVar68 + fVar72;
        auVar45 = vminps_avx(auVar81,auVar44);
        auVar81 = vblendvps_avx(auVar81,auVar45,auVar53);
        local_68 = auVar46._0_4_;
        fStack_64 = auVar46._4_4_;
        fStack_60 = auVar46._8_4_;
        fStack_5c = auVar46._12_4_;
        auVar64._0_4_ =
             fVar25 * local_68 + fVar70 * local_e8 + fVar3 * local_168 + fVar21 * local_1e8;
        auVar64._4_4_ =
             fVar26 * fStack_64 + fVar75 * fStack_e4 + fVar10 * fStack_164 + fVar63 * fStack_1e4;
        auVar64._8_4_ =
             fVar27 * fStack_60 + fVar77 * fStack_e0 + fVar11 * fStack_160 + fVar67 * fStack_1e0;
        auVar64._12_4_ =
             fVar28 * fStack_5c + fVar78 * fStack_dc + fVar12 * fStack_15c + fVar69 * fStack_1dc;
        auVar64._16_4_ =
             fVar29 * local_68 + fVar79 * local_e8 + fVar13 * local_168 + fVar71 * local_1e8;
        auVar64._20_4_ =
             fVar30 * fStack_64 + fVar22 * fStack_e4 + fVar19 * fStack_164 + fVar62 * fStack_1e4;
        auVar64._24_4_ =
             fVar31 * fStack_60 + fVar23 * fStack_e0 + fVar20 * fStack_160 + fVar66 * fStack_1e0;
        auVar64._28_4_ = auVar45._28_4_ + fVar72 + fVar74;
        auVar65 = ZEXT3264(auVar64);
        auVar45 = vminps_avx(auVar58,auVar61);
        auVar58 = vblendvps_avx(auVar58,auVar45,auVar53);
        auVar45 = vminps_avx(auVar49,auVar64);
        auVar76 = ZEXT3264(auVar45);
        auVar49 = vblendvps_avx(auVar49,auVar45,auVar53);
        local_88 = auVar39._0_4_;
        fStack_84 = auVar39._4_4_;
        fStack_80 = auVar39._8_4_;
        fStack_7c = auVar39._12_4_;
        auVar60._0_4_ =
             fVar25 * local_88 + fVar70 * local_108 + fVar3 * local_188 + fVar21 * local_208;
        auVar60._4_4_ =
             fVar26 * fStack_84 + fVar75 * fStack_104 + fVar10 * fStack_184 + fVar63 * fStack_204;
        auVar60._8_4_ =
             fVar27 * fStack_80 + fVar77 * fStack_100 + fVar11 * fStack_180 + fVar67 * fStack_200;
        auVar60._12_4_ =
             fVar28 * fStack_7c + fVar78 * fStack_fc + fVar12 * fStack_17c + fVar69 * fStack_1fc;
        auVar60._16_4_ =
             fVar29 * local_88 + fVar79 * local_108 + fVar13 * local_188 + fVar71 * local_208;
        auVar60._20_4_ =
             fVar30 * fStack_84 + fVar22 * fStack_104 + fVar19 * fStack_184 + fVar62 * fStack_204;
        auVar60._24_4_ =
             fVar31 * fStack_80 + fVar23 * fStack_100 + fVar20 * fStack_180 + fVar66 * fStack_200;
        auVar60._28_4_ = fVar73 + fVar24 + pfVar1[7] + fVar68;
        auVar45 = vmaxps_avx(auVar82,auVar44);
        auVar82 = vblendvps_avx(auVar82,auVar45,auVar53);
        auVar45 = vmaxps_avx(auVar80,auVar61);
        auVar80 = vblendvps_avx(auVar80,auVar45,auVar53);
        auVar45 = vmaxps_avx(auVar55,auVar64);
        auVar55 = vblendvps_avx(auVar55,auVar45,auVar53);
        auVar45._8_4_ = 0x7fffffff;
        auVar45._0_8_ = 0x7fffffff7fffffff;
        auVar45._12_4_ = 0x7fffffff;
        auVar45._16_4_ = 0x7fffffff;
        auVar45._20_4_ = 0x7fffffff;
        auVar45._24_4_ = 0x7fffffff;
        auVar45._28_4_ = 0x7fffffff;
        auVar45 = vandps_avx(auVar60,auVar45);
        auVar45 = vmaxps_avx(auVar43._0_32_,auVar45);
        auVar45 = vblendvps_avx(auVar43._0_32_,auVar45,auVar53);
        auVar43 = ZEXT3264(auVar45);
        uVar33 = uVar33 + 8;
      } while (uVar33 < uVar32);
    }
    auVar44 = vshufps_avx(auVar81,auVar81,0xb1);
    auVar81 = vminps_avx(auVar81,auVar44);
    auVar44 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vminps_avx(auVar81,auVar44);
    auVar39 = vminps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar81 = vshufps_avx(auVar58,auVar58,0xb1);
    auVar81 = vminps_avx(auVar58,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vminps_avx(auVar81,auVar58);
    auVar37 = vminps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar37 = vunpcklps_avx(auVar39,auVar37);
    auVar81 = vshufps_avx(auVar49,auVar49,0xb1);
    auVar81 = vminps_avx(auVar49,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vminps_avx(auVar81,auVar58);
    auVar39 = vminps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar37 = vinsertps_avx(auVar37,auVar39,0x28);
    auVar81 = vshufps_avx(auVar82,auVar82,0xb1);
    auVar81 = vmaxps_avx(auVar82,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vmaxps_avx(auVar81,auVar58);
    auVar39 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar81 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar81 = vmaxps_avx(auVar80,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vmaxps_avx(auVar81,auVar58);
    auVar46 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar46 = vunpcklps_avx(auVar39,auVar46);
    auVar81 = vshufps_avx(auVar55,auVar55,0xb1);
    auVar81 = vmaxps_avx(auVar55,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vmaxps_avx(auVar81,auVar58);
    auVar39 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar39 = vinsertps_avx(auVar46,auVar39,0x28);
    auVar81 = vshufps_avx(auVar45,auVar45,0xb1);
    auVar81 = vmaxps_avx(auVar45,auVar81);
    auVar58 = vshufpd_avx(auVar81,auVar81,5);
    auVar81 = vmaxps_avx(auVar81,auVar58);
    auVar46 = vmaxps_avx(auVar81._0_16_,auVar81._16_16_);
    auVar46 = vshufps_avx(auVar46,auVar46,0);
  }
  auVar40 = vinsertps_avx(auVar40,auVar41,0x30);
  auVar37 = vminps_avx(auVar37,auVar40);
  auVar40 = vmaxps_avx(auVar39,auVar40);
  auVar41 = vshufps_avx(auVar41,auVar41,0);
  auVar48._8_4_ = 0x7fffffff;
  auVar48._0_8_ = 0x7fffffff7fffffff;
  auVar48._12_4_ = 0x7fffffff;
  auVar41 = vandps_avx(auVar41,auVar48);
  auVar41 = vmaxps_avx(auVar46,auVar41);
  auVar39 = vsubps_avx(auVar37,auVar41);
  auVar38._0_4_ = auVar40._0_4_ + auVar41._0_4_;
  auVar38._4_4_ = auVar40._4_4_ + auVar41._4_4_;
  auVar38._8_4_ = auVar40._8_4_ + auVar41._8_4_;
  auVar38._12_4_ = auVar40._12_4_ + auVar41._12_4_;
  auVar41 = vandps_avx(auVar39,auVar48);
  auVar40 = vandps_avx(auVar38,auVar48);
  auVar41 = vmaxps_avx(auVar41,auVar40);
  auVar40 = vmovshdup_avx(auVar41);
  auVar40 = vmaxss_avx(auVar40,auVar41);
  auVar41 = vshufpd_avx(auVar41,auVar41,1);
  auVar41 = vmaxss_avx(auVar41,auVar40);
  auVar41 = ZEXT416((uint)(auVar41._0_4_ * 4.7683716e-07));
  auVar41 = vshufps_avx(auVar41,auVar41,0);
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar39,auVar41);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar38._0_4_ + auVar41._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar38._4_4_ + auVar41._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar38._8_4_ + auVar41._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar38._12_4_ + auVar41._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }